

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O0

void __thiscall libtorrent::upnp::rootdevice::rootdevice(rootdevice *this,rootdevice *param_1)

{
  bool bVar1;
  rootdevice *param_1_local;
  rootdevice *this_local;
  
  ::std::__cxx11::string::string((string *)this,(string *)param_1);
  ::std::__cxx11::string::string((string *)&this->control_url,(string *)&param_1->control_url);
  ::std::__cxx11::string::string
            ((string *)&this->service_namespace,(string *)&param_1->service_namespace);
  libtorrent::aux::
  container_wrapper<libtorrent::upnp::mapping_t,_libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>_>
  ::container_wrapper(&this->mapping,&param_1->mapping);
  ::std::__cxx11::string::string((string *)&this->hostname,(string *)&param_1->hostname);
  this->port = param_1->port;
  ::std::__cxx11::string::string((string *)&this->path,(string *)&param_1->path);
  libtorrent::aux::noexcept_movable<boost::asio::ip::address>::noexcept_movable
            (&this->external_ip,&param_1->external_ip);
  bVar1 = param_1->supports_specific_external;
  this->use_lease_duration = param_1->use_lease_duration;
  this->supports_specific_external = bVar1;
  this->disabled = param_1->disabled;
  ::std::shared_ptr<libtorrent::aux::http_connection>::shared_ptr
            (&this->upnp_connection,&param_1->upnp_connection);
  return;
}

Assistant:

upnp::rootdevice::rootdevice(rootdevice const&) = default;